

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_operators.cpp
# Opt level: O1

Matrix<long_double> *
neural_networks::utilities::matrix_operators::create(NeuralMatrix *other,Mode mod)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  Matrix<long_double> *this;
  size_t sVar4;
  unkbyte10 *pVar5;
  size_t sVar6;
  
  this = (Matrix<long_double> *)operator_new(0x30);
  Matrix<long_double>::Matrix
            (this,(other->super_Matrix<neural_networks::utilities::Neuron_*>).N,
             (other->super_Matrix<neural_networks::utilities::Neuron_*>).M);
  sVar1 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).N;
  if (mod == data) {
    if (sVar1 != 0) {
      sVar2 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
      sVar4 = 0;
      do {
        if (sVar2 != 0) {
          lVar3 = *(long *)&(other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
                            super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar4].
                            super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                            ._M_impl.super__Vector_impl_data;
          pVar5 = (this->matrix).
                  super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar4].
                  super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_start;
          sVar6 = 0;
          do {
            *pVar5 = *(unkbyte10 *)(*(long *)(lVar3 + sVar6 * 8) + 0x10);
            sVar6 = sVar6 + 1;
            pVar5 = pVar5 + 1;
          } while (sVar2 != sVar6);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != sVar1);
    }
  }
  else if (mod == function) {
    if (sVar1 != 0) {
      sVar2 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
      sVar4 = 0;
      do {
        if (sVar2 != 0) {
          lVar3 = *(long *)&(other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
                            super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar4].
                            super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                            ._M_impl.super__Vector_impl_data;
          pVar5 = (this->matrix).
                  super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar4].
                  super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_start;
          sVar6 = 0;
          do {
            *pVar5 = *(unkbyte10 *)(*(long *)(lVar3 + sVar6 * 8) + 0x20);
            sVar6 = sVar6 + 1;
            pVar5 = pVar5 + 1;
          } while (sVar2 != sVar6);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != sVar1);
    }
  }
  else if (sVar1 != 0) {
    sVar2 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
    sVar4 = 0;
    do {
      if (sVar2 != 0) {
        lVar3 = *(long *)&(other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
                          super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar4].
                          super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                          ._M_impl.super__Vector_impl_data;
        pVar5 = (this->matrix).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar4].
                super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                super__Vector_impl_data._M_start;
        sVar6 = 0;
        do {
          *pVar5 = *(unkbyte10 *)(*(long *)(lVar3 + sVar6 * 8) + 0x30);
          sVar6 = sVar6 + 1;
          pVar5 = pVar5 + 1;
        } while (sVar2 != sVar6);
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != sVar1);
  }
  return this;
}

Assistant:

Matrix<long double>* matrix_operators::create(const NeuralMatrix *other, const matrix_operators::Mode mod) {
    Matrix<long double> *new_matrix = new Matrix<long double>(other -> N, other -> M);
    if (new_matrix == nullptr) {
        std::cerr << "Error: Failed to copy NeuralMatrix object at [" << other << "]; not enough space\n";
        return nullptr;
    }
    register size_t i, j;
    switch(mod) {
        case matrix_operators::data: { // data
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> data;
                }
            }
            return new_matrix;
        };
        case matrix_operators::function: {
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> function;
                }
            }
            return new_matrix;
        };
        case matrix_operators::derivative: {
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> function_derivative;
                }
            }
            return new_matrix;
        };
    }
}